

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsDenseDQJac(realtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,ARKodeMem ark_mem,
                   ARKLsMem arkls_mem,ARKRhsFn fi,N_Vector tmp1)

{
  double dVar1;
  double dVar2;
  sunindextype sVar3;
  realtype *prVar4;
  realtype *prVar5;
  realtype *prVar6;
  long in_RCX;
  undefined8 in_RDI;
  long in_R8;
  code *in_R9;
  undefined8 in_XMM0_Qa;
  realtype rVar7;
  undefined8 in_stack_00000008;
  int retval;
  sunindextype N;
  sunindextype j;
  N_Vector jthCol;
  N_Vector ftemp;
  realtype *cns_data;
  realtype *ewt_data;
  realtype *y_data;
  realtype conj;
  realtype srur;
  realtype yjsaved;
  realtype inc_inv;
  realtype inc;
  realtype minInc;
  realtype fnorm;
  N_Vector in_stack_ffffffffffffff38;
  N_Vector in_stack_ffffffffffffff40;
  realtype *prVar8;
  realtype *v_data;
  N_Vector p_Var9;
  N_Vector x;
  realtype *prVar10;
  int local_a4;
  int local_9c;
  N_Vector local_50;
  
  local_a4 = 0;
  sVar3 = SUNDenseMatrix_Columns((SUNMatrix)in_stack_ffffffffffffff38);
  N_VCloneEmpty(in_stack_ffffffffffffff40);
  prVar4 = N_VGetArrayPointer((N_Vector)0x1152ca4);
  prVar5 = N_VGetArrayPointer((N_Vector)0x1152cb6);
  if (*(int *)(in_RCX + 0x80) == 0) {
    prVar6 = (realtype *)0x0;
  }
  else {
    prVar6 = N_VGetArrayPointer((N_Vector)0x1152ce0);
  }
  prVar10 = prVar6;
  if (0.0 < *(double *)(in_RCX + 8)) {
    p_Var9 = (N_Vector)sqrt(*(double *)(in_RCX + 8));
  }
  else {
    p_Var9 = (N_Vector)0x0;
  }
  x = p_Var9;
  rVar7 = N_VWrmsNorm(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((rVar7 != 0.0) || (NAN(rVar7))) {
    prVar8 = (realtype *)
             (ABS(*(double *)(in_RCX + 0x168)) * 1000.0 * *(double *)(in_RCX + 8) * (double)sVar3 *
             rVar7);
  }
  else {
    prVar8 = (realtype *)&DAT_3ff0000000000000;
  }
  v_data = prVar8;
  for (local_9c = 0; local_9c < sVar3; local_9c = local_9c + 1) {
    SUNDenseMatrix_Column((SUNMatrix)in_stack_ffffffffffffff38,0);
    N_VSetArrayPointer(v_data,in_stack_ffffffffffffff38);
    dVar1 = prVar5[local_9c];
    if ((double)p_Var9 * ABS(dVar1) <= (double)prVar8 / prVar4[local_9c]) {
      in_stack_ffffffffffffff38 = (N_Vector)((double)prVar8 / prVar4[local_9c]);
    }
    else {
      in_stack_ffffffffffffff38 = (N_Vector)((double)p_Var9 * ABS(dVar1));
    }
    local_50 = in_stack_ffffffffffffff38;
    if (*(int *)(in_RCX + 0x80) != 0) {
      dVar2 = prVar6[local_9c];
      if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
        if ((ABS(dVar2) == 2.0) &&
           ((!NAN(ABS(dVar2)) && ((dVar1 + (double)in_stack_ffffffffffffff38) * dVar2 <= 0.0)))) {
          local_50 = (N_Vector)((ulong)in_stack_ffffffffffffff38 ^ 0x8000000000000000);
        }
      }
      else if ((dVar1 + (double)in_stack_ffffffffffffff38) * dVar2 < 0.0) {
        local_50 = (N_Vector)((ulong)in_stack_ffffffffffffff38 ^ 0x8000000000000000);
      }
    }
    prVar5[local_9c] = (double)local_50 + prVar5[local_9c];
    local_a4 = (*in_R9)(in_XMM0_Qa,in_RDI,in_stack_00000008,*(undefined8 *)(in_RCX + 0x10));
    *(long *)(in_R8 + 0x88) = *(long *)(in_R8 + 0x88) + 1;
    if (local_a4 != 0) break;
    prVar5[local_9c] = dVar1;
    N_VLinearSum((realtype)prVar10,x,(realtype)v_data,in_stack_ffffffffffffff38,(N_Vector)0x1153070)
    ;
  }
  N_VSetArrayPointer(v_data,in_stack_ffffffffffffff38);
  N_VDestroy((N_Vector)0x1153098);
  return local_a4;
}

Assistant:

int arkLsDenseDQJac(realtype t, N_Vector y, N_Vector fy,
                    SUNMatrix Jac, ARKodeMem ark_mem,
                    ARKLsMem arkls_mem, ARKRhsFn fi,
                    N_Vector tmp1)
{
  realtype     fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  realtype    *y_data, *ewt_data, *cns_data;
  N_Vector     ftemp, jthCol;
  sunindextype j, N;
  int          retval = 0;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readibility */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for various vectors */
  ewt_data = N_VGetArrayPointer(ark_mem->ewt);
  y_data   = N_VGetArrayPointer(y);
  cns_data = (ark_mem->constraintsSet) ?
    N_VGetArrayPointer(ark_mem->constraints) : NULL;

  /* Set minimum increment based on uround and norm of f */
  srur = SUNRsqrt(ark_mem->uround);
  fnorm = N_VWrmsNorm(fy, ark_mem->rwt);
  minInc = (fnorm != ZERO) ?
    (MIN_INC_MULT * SUNRabs(ark_mem->h) * ark_mem->uround * N * fnorm) : ONE;

  for (j = 0; j < N; j++) {

    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac,j), jthCol);

    yjsaved = y_data[j];
    inc = SUNMAX(srur*SUNRabs(yjsaved), minInc/ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (ark_mem->constraintsSet) {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)      {if ((yjsaved+inc)*conj < ZERO)  inc = -inc;}
      else if (SUNRabs(conj) == TWO) {if ((yjsaved+inc)*conj <= ZERO) inc = -inc;}
    }

    y_data[j] += inc;

    retval = fi(t, y, ftemp, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval != 0) break;

    y_data[j] = yjsaved;

    inc_inv = ONE/inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);

  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol);  /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return(retval);
}